

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmPTest<(moira::Instr)185,(moira::Mode)8,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  char cVar8;
  anon_class_4_1_ba1d4581 preg;
  uint uVar9;
  uint uVar10;
  Ea<(moira::Mode)8,_2> result;
  u32 local_44;
  ushort local_40;
  uint local_3c;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar5 = (*this->_vptr_Moira[6])();
  uVar9 = uVar5 & 0xffff;
  if (((str->style->syntax & ~MOIRA_MIT) == GNU) &&
     (((uVar9 >> 8 & 1) == 0 && (uVar5 & 0xe0) != 0 || ((uVar5 & 6) != 0 && (uVar5 & 0x18) == 0))))
  {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)185,(moira::Mode)8,4>(this,str,addr,op);
    return;
  }
  cVar8 = 'p';
  lVar6 = 1;
  do {
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = cVar8;
    cVar8 = "ptest"[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  pcVar7 = "r";
  if ((uVar9 >> 9 & 1) == 0) {
    pcVar7 = "w";
  }
  cVar8 = *pcVar7;
  while (cVar8 != '\0') {
    pcVar7 = pcVar7 + 1;
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = cVar8;
    cVar8 = *pcVar7;
  }
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    } while (str->ptr < str->base + iVar2);
  }
  StrWriter::operator<<(str,(Fc)(uVar5 & 0x1f));
  s = &str->ptr;
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = ',';
  SVar3 = str->style->syntax;
  if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
    pcVar7 = *s;
    *s = pcVar7 + 1;
    *pcVar7 = ' ';
  }
  local_44 = *addr;
  *addr = local_44 + 2;
  local_40 = op & 7;
  local_3c = (*this->_vptr_Moira[6])(this);
  local_3c = local_3c & 0xffff;
  uVar10 = local_3c << 0x10;
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[6])(this);
  local_3c = uVar5 & 0xffff | uVar10;
  StrWriter::operator<<(str,(Ea<(moira::Mode)8,_2> *)&local_44);
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = ',';
  SVar3 = str->style->syntax;
  if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
    pcVar7 = *s;
    *s = pcVar7 + 1;
    *pcVar7 = ' ';
  }
  sprintd_signed(s,(ulong)(uVar9 >> 10 & 7));
  if ((uVar9 >> 8 & 1) != 0) {
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ',';
    SVar3 = str->style->syntax;
    if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    StrWriter::operator<<(str,(An)(uVar9 >> 5 & 7));
  }
  return;
}

Assistant:

void
Moira::dasmPTest(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead<Word>(addr);
    auto reg = _____________xxx (op);
    auto lev = ___xxx__________ (ext);
    auto rw  = ______x_________ (ext);
    auto a   = _______x________ (ext);
    auto an  = ________xxx_____ (ext);
    auto fc  = ___________xxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << (rw ? "r" : "w") << str.tab;
    str << Fc{fc} << Sep{} << Op<M>(reg, addr) << Sep{} << lev;
    if (a) { str << Sep{} << An{an}; }
}